

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

void __thiscall obs::signal<void_()>::operator()<>(signal<void_()> *this)

{
  bool bVar1;
  slot<void_()> *this_00;
  iterator __end0;
  iterator __begin0;
  iterator local_60;
  iterator local_38;
  
  safe_list<obs::slot<void_()>_>::begin(&local_38,&this->m_slots);
  safe_list<obs::slot<void_()>_>::end(&local_60,&this->m_slots);
  while( true ) {
    bVar1 = safe_list<obs::slot<void_()>_>::iterator::operator!=(&local_38,&local_60);
    if (!bVar1) break;
    this_00 = safe_list<obs::slot<void_()>_>::iterator::operator*(&local_38);
    if (this_00 != (slot<void_()> *)0x0) {
      slot<void_()>::operator()<>(this_00);
    }
    safe_list<obs::slot<void_()>_>::iterator::operator++(&local_38);
  }
  safe_list<obs::slot<void_()>_>::iterator::~iterator(&local_60);
  safe_list<obs::slot<void_()>_>::iterator::~iterator(&local_38);
  return;
}

Assistant:

void operator()(Args2&&...args) {
    for (auto slot : m_slots)
      if (slot)
        (*slot)(std::forward<Args2>(args)...);
  }